

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O0

int __thiscall
CVmObjFile::getp_setMode(CVmObjFile *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  uchar uVar1;
  int iVar2;
  vm_obj_id_t charset;
  vmobjfile_ext_t *flags_00;
  int *in_RCX;
  int in_EDX;
  CVmObjFile *in_RDI;
  int access;
  unsigned_long flags;
  CVmNetFile *netfile;
  CVmDataSource *fp;
  vmobjfile_ext_t *ext;
  int create_readbuf;
  vm_obj_id_t cset;
  int mode;
  int argc;
  undefined4 in_stack_ffffffffffffff68;
  vm_obj_id_t in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  vm_val_t *in_stack_ffffffffffffff78;
  int local_7c;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffcc;
  CVmObjFile *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffe8;
  
  if ((getp_setMode(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getp_setMode(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar2 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_setMode::desc,1,1);
    __cxa_guard_release(&getp_setMode(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  if (in_RCX == (int *)0x0) {
    local_7c = 0;
  }
  else {
    local_7c = *in_RCX;
  }
  iVar2 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff78,
                     (uint *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (CVmNativeCodeDesc *)
                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (iVar2 == 0) {
    check_valid_file((CVmObjFile *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    charset = CVmBif::pop_int_val();
    local_7c = local_7c + -1;
    uVar3 = 0;
    flags_00 = get_ext(in_RDI);
    iVar2 = (int)((ulong)flags_00->fp >> 0x20);
    uVar1 = flags_00->access;
    if (charset == 1) {
      get_charset_arg((int)((ulong)flags_00->netfile >> 0x20),(int)flags_00->netfile);
      if (uVar1 == '\x01') {
        uVar3 = 1;
      }
    }
    else {
      if (1 < charset - 2) {
        err_throw(0);
      }
      if (1 < local_7c) {
        CVmStack::discard();
      }
    }
    CVmRun::push_obj_or_nil
              ((CVmRun *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff6c);
    flags_00->fp = (CVmDataSource *)0x0;
    flags_00->netfile = (CVmNetFile *)0x0;
    alloc_ext(in_stack_ffffffffffffffd0,(CVmNetFile *)CONCAT44(in_stack_ffffffffffffffcc,local_7c),
              charset,(CVmDataSource *)CONCAT44(uVar3,in_stack_ffffffffffffffb8),
              (unsigned_long)flags_00,iVar2,in_EDX,in_stack_ffffffffffffffe8);
    CVmStack::discard(local_7c + 1);
  }
  return 1;
}

Assistant:

int CVmObjFile::getp_setMode(VMG_ vm_obj_id_t self, vm_val_t *retval,
                             uint *oargc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(1, 1);
    int argc = (oargc != 0 ? *oargc : 0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;
    
    /* make sure we are allowed to perform operations on the file */
    check_valid_file(vmg0_);
    
    /* retrieve the mode argument */
    int mode = CVmBif::pop_int_val(vmg0_);
    --argc;

    /* presume no character set or read buffer */
    vm_obj_id_t cset = VM_INVALID_OBJ;
    int create_readbuf = FALSE;

    /* save the retained settings from the current extension */
    vmobjfile_ext_t *ext = get_ext();
    CVmDataSource *fp = ext->fp;
    CVmNetFile *netfile = ext->netfile;
    unsigned long flags = ext->flags;
    int access = ext->access;

    /* check the mode */
    switch (mode)
    {
    case VMOBJFILE_MODE_TEXT:
        /* text mode - we need a character mapper in this mode */
        cset = get_charset_arg(vmg_ 0, argc);

        /* 
         *   if we're open with read access, we need a read buffer in order
         *   to do the character set translation 
         */
        if (access == VMOBJFILE_ACCESS_READ)
            create_readbuf = TRUE;
        break;

    case VMOBJFILE_MODE_DATA:
    case VMOBJFILE_MODE_RAW:
        /* 
         *   data mode or raw mode - we don't use a character mapper for this
         *   mode, so if the argument is present, simply discard it 
         */
        if (argc >= 2)
            G_stk->discard();
        break;

    default:
        /* invalid mode */
        err_throw(VMERR_BAD_VAL_BIF);
    }
    
    /* push the character set object (if any) for gc protection */
    G_stk->push_obj_or_nil(vmg_ cset);

    /* 
     *   remove the data source and network file descriptor from the
     *   extension, so that they're not deleted when we reallocate it 
     */
    ext->fp = 0;
    ext->netfile = 0;

    /* 
     *   Reallocate the extension.  This will set up the correct structures
     *   for the new file mode. 
     */
    alloc_ext(vmg_ netfile, cset, fp, flags, mode, access, create_readbuf);

    /* discard arguments and gc protection */
    G_stk->discard(argc + 1);

    /* handled */
    return TRUE;
}